

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

Instr * __thiscall
IRBuilder::BuildProfiledFieldLoad
          (IRBuilder *this,OpCode loadOp,RegOpnd *dstOpnd,SymOpnd *srcOpnd,CacheId inlineCacheIndex,
          bool *pUnprofiled)

{
  bool bVar1;
  JitProfilingInstr *pJVar2;
  ProfiledInstr *this_00;
  JITTimeProfileInfo *this_01;
  TSize *pTVar3;
  ProfiledInstr *pPVar4;
  JITTimeFunctionBody *this_02;
  char16 *pcVar5;
  char16 *pcVar6;
  char local_198 [8];
  char valueTypeStr [256];
  char16 debugStringBuffer [42];
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType valueType;
  
  bVar1 = Func::DoSimpleJitDynamicProfile(this->m_func);
  if (bVar1) {
    pJVar2 = IR::JitProfilingInstr::New
                       (loadOp,&dstOpnd->super_Opnd,&srcOpnd->super_Opnd,this->m_func);
    return &pJVar2->super_Instr;
  }
  bVar1 = Func::HasProfileInfo(this->m_func);
  if (bVar1) {
    this_00 = IR::ProfiledInstr::New(loadOp,&dstOpnd->super_Opnd,&srcOpnd->super_Opnd,this->m_func);
    this_01 = Func::GetReadOnlyProfileInfo(this->m_func);
    pTVar3 = (TSize *)JITTimeProfileInfo::GetFldInfo(this_01,inlineCacheIndex);
    pPVar4 = IR::Instr::AsProfiledInstr(&this_00->super_Instr);
    (pPVar4->u).field_3.fldInfoData = *pTVar3;
    pPVar4 = IR::Instr::AsProfiledInstr(&this_00->super_Instr);
    bVar1 = Js::FldInfo::WasLdFldProfiled((FldInfo *)&(pPVar4->u).field_3);
    *pUnprofiled = !bVar1;
    pPVar4 = IR::Instr::AsProfiledInstr(&this_00->super_Instr);
    IR::Opnd::SetValueType(&dstOpnd->super_Opnd,(ValueType)(pPVar4->u).field_3.fldInfoData.f1);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,DynamicProfilePhase);
    if (bVar1) {
      pPVar4 = IR::Instr::AsProfiledInstr(&this_00->super_Instr);
      local_32[0] = (anon_union_2_4_ea848c7b_for_ValueType_13)(pPVar4->u).field_3.fldInfoData.f1;
      ValueType::ToString((ValueType *)&local_32[0].field_0,(char (*) [256])local_198);
      this_02 = Func::GetJITFunctionBody(this->m_func);
      pcVar5 = JITTimeFunctionBody::GetDisplayName(this_02);
      pcVar6 = Func::GetDebugNumberSet(this->m_func,(wchar (*) [42])(valueTypeStr + 0xf8));
      Output::Print(L"TestTrace function %s (%s) ValueType = %i ",pcVar5,pcVar6,
                    (char (*) [256])local_198);
      IR::Instr::DumpTestTrace(&this_00->super_Instr);
    }
  }
  else {
    this_00 = (ProfiledInstr *)0x0;
  }
  return &this_00->super_Instr;
}

Assistant:

IR::Instr *
IRBuilder::BuildProfiledFieldLoad(Js::OpCode loadOp, IR::RegOpnd *dstOpnd, IR::SymOpnd *srcOpnd, Js::CacheId inlineCacheIndex, bool *pUnprofiled)
{
    IR::Instr * instr = nullptr;

    // Prefer JitProfilingInstr if we're in simplejit
    if (m_func->DoSimpleJitDynamicProfile())
    {
        instr = IR::JitProfilingInstr::New(loadOp, dstOpnd, srcOpnd, m_func);
    }
    else if (this->m_func->HasProfileInfo())
    {
        instr = IR::ProfiledInstr::New(loadOp, dstOpnd, srcOpnd, m_func);
        instr->AsProfiledInstr()->u.FldInfo() = *(m_func->GetReadOnlyProfileInfo()->GetFldInfo(inlineCacheIndex));
        *pUnprofiled = !instr->AsProfiledInstr()->u.FldInfo().WasLdFldProfiled();
        dstOpnd->SetValueType(instr->AsProfiledInstr()->u.FldInfo().valueType);
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if(Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::DynamicProfilePhase))
        {
            const ValueType valueType(instr->AsProfiledInstr()->u.FldInfo().valueType);
            char valueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
            valueType.ToString(valueTypeStr);
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            Output::Print(_u("TestTrace function %s (%s) ValueType = %i "), m_func->GetJITFunctionBody()->GetDisplayName(), m_func->GetDebugNumberSet(debugStringBuffer), valueTypeStr);
            instr->DumpTestTrace();
        }
#endif
    }

    return instr;
}